

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_sse_harley_seal_improved(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  undefined1 (*in_RDX) [16];
  uint in_ESI;
  long in_RDI;
  longlong in_R8;
  longlong in_R9;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  __m128i c_07;
  __m128i c_08;
  __m128i c_09;
  __m128i c_10;
  __m128i c_11;
  __m128i c_12;
  __m128i c_13;
  int j_4;
  size_t i_6;
  int j_3;
  size_t i_5;
  int j_2;
  size_t i_4;
  int j_1;
  size_t i_3;
  __m128i s_3;
  __m128i f_3;
  __m128i *ptr_3;
  __m128i s_2;
  __m128i f_2;
  __m128i *ptr_2;
  __m128i s_1;
  __m128i f_1;
  __m128i *ptr_1;
  __m128i s;
  __m128i f;
  __m128i *ptr;
  __m128i mask_byte0_1;
  __m128i tmp1_5;
  __m128i tmp0_5;
  __m128i t2_1;
  __m128i tmp1_4;
  __m128i tmp0_4;
  __m128i t1_1;
  __m128i tmp1_3;
  __m128i tmp0_3;
  __m128i t0_1;
  __m128i mask_byte0;
  __m128i tmp1_2;
  __m128i tmp0_2;
  __m128i t2;
  __m128i tmp1_1;
  __m128i tmp0_1;
  __m128i t1;
  __m128i tmp1;
  __m128i tmp0;
  __m128i t0;
  size_t thislimit;
  size_t i_2;
  __m128i counter [4];
  uint16_t buffer [8];
  uint64_t i;
  uint64_t limit;
  __m128i eightsB;
  __m128i eightsA;
  __m128i foursB;
  __m128i foursA;
  __m128i twosB;
  __m128i twosA;
  __m128i v16;
  __m128i v8;
  __m128i v4;
  __m128i v2;
  __m128i v1;
  size_t size;
  __m128i *data;
  int j;
  uint32_t i_1;
  int local_d94;
  ulong local_d90;
  int local_d84;
  ulong local_d80;
  int local_d74;
  ulong local_d70;
  int local_d64;
  ulong local_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  ulong local_b58;
  ulong local_b50;
  undefined1 local_b48 [16];
  undefined1 local_b38 [16];
  undefined1 local_b28 [16];
  undefined1 local_b18 [16];
  longlong local_b08;
  longlong lStack_b00;
  ulong local_af8;
  ulong local_af0;
  longlong local_ae8 [2];
  longlong local_ad8 [2];
  longlong local_ac8 [2];
  longlong local_ab8 [2];
  longlong local_aa8 [2];
  longlong local_a98 [2];
  longlong local_a88;
  longlong lStack_a80;
  longlong local_a78;
  longlong lStack_a70;
  longlong local_a68;
  longlong lStack_a60;
  longlong local_a58;
  longlong lStack_a50;
  longlong local_a48;
  longlong lStack_a40;
  ulong local_a38;
  long local_a30;
  int local_a28;
  uint local_a24;
  undefined1 (*local_a20) [16];
  undefined1 local_988 [16];
  undefined8 local_978;
  undefined8 uStack_970;
  undefined1 local_968 [16];
  undefined8 local_958;
  undefined8 uStack_950;
  undefined1 local_948 [16];
  undefined8 local_938;
  undefined8 uStack_930;
  undefined1 local_928 [16];
  undefined8 local_918;
  undefined8 uStack_910;
  undefined1 local_908 [16];
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined1 local_8e8 [16];
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined1 local_8a8 [16];
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined1 local_878 [16];
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined1 local_838 [16];
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined1 local_7f8 [16];
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  longlong local_7d8;
  longlong lStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined1 local_7b8 [16];
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined1 local_778 [16];
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined1 local_738 [16];
  undefined8 local_728;
  undefined8 uStack_720;
  longlong local_718;
  longlong lStack_710;
  long local_6e8;
  long local_6e0;
  long local_6d8;
  long local_6d0;
  long local_6c8;
  long local_6c0;
  long local_6b8;
  long local_6b0;
  long local_6a8;
  long local_6a0;
  long local_698;
  long local_690;
  long local_688;
  long local_680;
  long local_678;
  long local_670;
  undefined1 local_668 [16];
  undefined1 local_658 [16];
  undefined1 local_648 [16];
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  undefined1 local_618 [16];
  undefined1 local_604;
  undefined1 local_603;
  undefined1 local_602;
  undefined1 local_601;
  undefined1 local_600;
  undefined1 local_5ff;
  undefined1 local_5fe;
  undefined1 local_5fd;
  undefined1 local_5fc;
  undefined1 local_5fb;
  undefined1 local_5fa;
  undefined1 local_5f9;
  undefined4 local_47c;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined4 local_45c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined4 local_43c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined4 local_41c;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined4 local_3fc;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined4 local_3dc;
  longlong local_3d8;
  longlong lStack_3d0;
  undefined4 local_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined4 local_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined4 local_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined4 local_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined4 local_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined4 local_31c;
  longlong local_318;
  longlong lStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined4 local_244;
  undefined4 local_240;
  undefined1 local_1c8 [16];
  undefined1 local_1b8;
  undefined1 local_1b7;
  undefined1 local_1b6;
  undefined1 local_1b5;
  undefined1 local_1b4;
  undefined1 local_1b3;
  undefined1 local_1b2;
  undefined1 local_1b1;
  undefined1 local_1b0;
  undefined1 local_1af;
  undefined1 local_1ae;
  undefined1 local_1ad;
  undefined1 local_1ac;
  undefined1 local_1ab;
  undefined1 local_1aa;
  undefined1 local_1a9;
  undefined1 local_1a8 [16];
  undefined1 local_198;
  undefined1 local_197;
  undefined1 local_196;
  undefined1 local_195;
  undefined1 local_194;
  undefined1 local_193;
  undefined1 local_192;
  undefined1 local_191;
  undefined1 local_190;
  undefined1 local_18f;
  undefined1 local_18e;
  undefined1 local_18d;
  undefined1 local_18c;
  undefined1 local_18b;
  undefined1 local_18a;
  undefined1 local_189;
  undefined1 local_188 [16];
  undefined1 local_178;
  undefined1 local_177;
  undefined1 local_176;
  undefined1 local_175;
  undefined1 local_174;
  undefined1 local_173;
  undefined1 local_172;
  undefined1 local_171;
  undefined1 local_170;
  undefined1 local_16f;
  undefined1 local_16e;
  undefined1 local_16d;
  undefined1 local_16c;
  undefined1 local_16b;
  undefined1 local_16a;
  undefined1 local_169;
  undefined1 local_168 [16];
  undefined1 local_158;
  undefined1 local_157;
  undefined1 local_156;
  undefined1 local_155;
  undefined1 local_154;
  undefined1 local_153;
  undefined1 local_152;
  undefined1 local_151;
  undefined1 local_150;
  undefined1 local_14f;
  undefined1 local_14e;
  undefined1 local_14d;
  undefined1 local_14c;
  undefined1 local_14b;
  undefined1 local_14a;
  undefined1 local_149;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_137;
  undefined1 local_136;
  undefined1 local_135;
  undefined1 local_134;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  undefined1 local_130;
  undefined1 local_12f;
  undefined1 local_12e;
  undefined1 local_12d;
  undefined1 local_12c;
  undefined1 local_12b;
  undefined1 local_12a;
  undefined1 local_129;
  undefined1 local_128 [16];
  undefined1 local_118;
  undefined1 local_117;
  undefined1 local_116;
  undefined1 local_115;
  undefined1 local_114;
  undefined1 local_113;
  undefined1 local_112;
  undefined1 local_111;
  undefined1 local_110;
  undefined1 local_10f;
  undefined1 local_10e;
  undefined1 local_10d;
  undefined1 local_10c;
  undefined1 local_10b;
  undefined1 local_10a;
  undefined1 local_109;
  undefined1 local_108 [16];
  undefined1 local_f8;
  undefined1 local_f7;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_f4;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  undefined1 local_f0;
  undefined1 local_ef;
  undefined1 local_ee;
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  undefined1 local_e8 [16];
  undefined1 local_d8;
  undefined1 local_d7;
  undefined1 local_d6;
  undefined1 local_d5;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined1 local_c8 [16];
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  undefined1 local_b0;
  undefined1 local_af;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined1 local_a8 [16];
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined1 local_88 [16];
  undefined1 local_78;
  undefined1 local_77;
  undefined1 local_76;
  undefined1 local_75;
  undefined1 local_74;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  undefined1 local_70;
  undefined1 local_6f;
  undefined1 local_6e;
  undefined1 local_6d;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  undefined1 local_68 [16];
  undefined1 local_58;
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined1 local_48 [16];
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined1 local_28 [16];
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  undefined1 (*pauVar7) [16];
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  longlong extraout_RDX_07;
  longlong extraout_RDX_08;
  longlong extraout_RDX_09;
  longlong extraout_RDX_10;
  longlong extraout_RDX_11;
  undefined1 (*extraout_RDX_12) [16];
  
  pauVar7 = in_RDX;
  for (local_a24 = in_ESI - (in_ESI & 0x7f); local_a24 < in_ESI; local_a24 = local_a24 + 1) {
    for (local_a28 = 0; local_a28 < 0x10; local_a28 = local_a28 + 1) {
      uVar6 = ((int)((uint)*(ushort *)(in_RDI + (ulong)local_a24 * 2) &
                    1 << ((byte)local_a28 & 0x1f)) >> ((byte)local_a28 & 0x1f)) +
              *(int *)(*in_RDX + (long)local_a28 * 4);
      pauVar7 = (undefined1 (*) [16])(ulong)uVar6;
      *(uint *)(*in_RDX + (long)local_a28 * 4) = uVar6;
    }
  }
  local_a38 = (ulong)(in_ESI >> 3);
  local_618 = (undefined1  [16])0x0;
  local_a48 = 0;
  lStack_a40 = 0;
  local_628 = (undefined1  [16])0x0;
  local_a58 = 0;
  lStack_a50 = 0;
  local_638 = (undefined1  [16])0x0;
  local_a68 = 0;
  lStack_a60 = 0;
  local_648 = (undefined1  [16])0x0;
  local_a78 = 0;
  lStack_a70 = 0;
  local_658 = (undefined1  [16])0x0;
  local_a88 = 0;
  lStack_a80 = 0;
  local_af0 = local_a38 - (local_a38 & 0xf);
  local_af8 = 0;
  for (local_b50 = 0; local_a30 = in_RDI, local_a20 = in_RDX, local_b50 < 4;
      local_b50 = local_b50 + 1) {
    local_668 = (undefined1  [16])0x0;
    *(undefined8 *)(local_b48 + local_b50 * 0x10) = 0;
    *(undefined8 *)(local_b48 + local_b50 * 0x10 + 8) = 0;
  }
  while (local_af8 < local_af0) {
    local_b58 = local_af0;
    if (0xffff < local_af0 - local_af8) {
      local_b58 = local_af8 + 0xffff;
    }
    for (; local_af8 < local_b58; local_af8 = local_af8 + 0x10) {
      local_670 = local_a30 + local_af8 * 0x10;
      b[1] = local_af8 * 0x10;
      local_678 = local_a30 + 0x10 + b[1];
      b[0] = (longlong)pauVar7;
      c[1] = in_R9;
      c[0] = in_R8;
      pospopcnt_csa_sse(&local_a98,(__m128i *)&local_a48,b,c);
      local_680 = local_a30 + 0x20 + local_af8 * 0x10;
      b_00[1] = local_af8 * 0x10;
      local_688 = local_a30 + 0x30 + b_00[1];
      b_00[0] = extraout_RDX;
      c_00[1] = in_R9;
      c_00[0] = in_R8;
      pospopcnt_csa_sse(&local_aa8,(__m128i *)&local_a48,b_00,c_00);
      b_01[1] = b_00[1];
      b_01[0] = extraout_RDX_00;
      c_01[1] = in_R9;
      c_01[0] = in_R8;
      pospopcnt_csa_sse(&local_ab8,(__m128i *)&local_a58,b_01,c_01);
      local_690 = local_a30 + 0x40 + local_af8 * 0x10;
      b_02[1] = local_af8 * 0x10;
      local_698 = local_a30 + 0x50 + b_02[1];
      b_02[0] = extraout_RDX_01;
      c_02[1] = in_R9;
      c_02[0] = in_R8;
      pospopcnt_csa_sse(&local_a98,(__m128i *)&local_a48,b_02,c_02);
      local_6a0 = local_a30 + 0x60 + local_af8 * 0x10;
      b_03[1] = local_af8 * 0x10;
      local_6a8 = local_a30 + 0x70 + b_03[1];
      b_03[0] = extraout_RDX_02;
      c_03[1] = in_R9;
      c_03[0] = in_R8;
      pospopcnt_csa_sse(&local_aa8,(__m128i *)&local_a48,b_03,c_03);
      b_04[1] = b_03[1];
      b_04[0] = extraout_RDX_03;
      c_04[1] = in_R9;
      c_04[0] = in_R8;
      pospopcnt_csa_sse(&local_ac8,(__m128i *)&local_a58,b_04,c_04);
      b_05[1] = b_03[1];
      b_05[0] = extraout_RDX_04;
      c_05[1] = in_R9;
      c_05[0] = in_R8;
      pospopcnt_csa_sse(&local_ad8,(__m128i *)&local_a68,b_05,c_05);
      local_6b0 = local_a30 + 0x80 + local_af8 * 0x10;
      b_06[1] = local_af8 * 0x10;
      local_6b8 = local_a30 + 0x90 + b_06[1];
      b_06[0] = extraout_RDX_05;
      c_06[1] = in_R9;
      c_06[0] = in_R8;
      pospopcnt_csa_sse(&local_a98,(__m128i *)&local_a48,b_06,c_06);
      local_6c0 = local_a30 + 0xa0 + local_af8 * 0x10;
      b_07[1] = local_af8 * 0x10;
      local_6c8 = local_a30 + 0xb0 + b_07[1];
      b_07[0] = extraout_RDX_06;
      c_07[1] = in_R9;
      c_07[0] = in_R8;
      pospopcnt_csa_sse(&local_aa8,(__m128i *)&local_a48,b_07,c_07);
      b_08[1] = b_07[1];
      b_08[0] = extraout_RDX_07;
      c_08[1] = in_R9;
      c_08[0] = in_R8;
      pospopcnt_csa_sse(&local_ab8,(__m128i *)&local_a58,b_08,c_08);
      local_6d0 = local_a30 + 0xc0 + local_af8 * 0x10;
      b_09[1] = local_af8 * 0x10;
      local_6d8 = local_a30 + 0xd0 + b_09[1];
      b_09[0] = extraout_RDX_08;
      c_09[1] = in_R9;
      c_09[0] = in_R8;
      pospopcnt_csa_sse(&local_a98,(__m128i *)&local_a48,b_09,c_09);
      local_6e0 = local_a30 + 0xe0 + local_af8 * 0x10;
      b_10[1] = local_af8 * 0x10;
      local_6e8 = local_a30 + 0xf0 + b_10[1];
      b_10[0] = extraout_RDX_09;
      c_10[1] = in_R9;
      c_10[0] = in_R8;
      pospopcnt_csa_sse(&local_aa8,(__m128i *)&local_a48,b_10,c_10);
      b_11[1] = b_10[1];
      b_11[0] = extraout_RDX_10;
      c_11[1] = in_R9;
      c_11[0] = in_R8;
      pospopcnt_csa_sse(&local_ac8,(__m128i *)&local_a58,b_11,c_11);
      b_12[1] = b_10[1];
      b_12[0] = extraout_RDX_11;
      c_12[1] = in_R9;
      c_12[0] = in_R8;
      pospopcnt_csa_sse(&local_ae8,(__m128i *)&local_a68,b_12,c_12);
      local_5f9 = 0x55;
      local_1a9 = 0x55;
      local_1aa = 0x55;
      local_1ab = 0x55;
      local_1ac = 0x55;
      local_1ad = 0x55;
      local_1ae = 0x55;
      local_1af = 0x55;
      local_1b0 = 0x55;
      local_1b1 = 0x55;
      local_1b2 = 0x55;
      local_1b3 = 0x55;
      local_1b4 = 0x55;
      local_1b5 = 0x55;
      local_1b6 = 0x55;
      local_1b7 = 0x55;
      local_1b8 = 0x55;
      auVar1 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
      auVar1 = vpinsrb_avx(auVar1,0x55,2);
      auVar1 = vpinsrb_avx(auVar1,0x55,3);
      auVar1 = vpinsrb_avx(auVar1,0x55,4);
      auVar1 = vpinsrb_avx(auVar1,0x55,5);
      auVar1 = vpinsrb_avx(auVar1,0x55,6);
      auVar1 = vpinsrb_avx(auVar1,0x55,7);
      auVar1 = vpinsrb_avx(auVar1,0x55,8);
      auVar1 = vpinsrb_avx(auVar1,0x55,9);
      auVar1 = vpinsrb_avx(auVar1,0x55,10);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xb);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xc);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xd);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xe);
      local_1c8 = vpinsrb_avx(auVar1,0x55,0xf);
      local_718 = local_a88;
      lStack_710 = lStack_a80;
      local_728 = local_1c8._0_8_;
      uStack_720 = local_1c8._8_8_;
      auVar1._8_8_ = lStack_a80;
      auVar1._0_8_ = local_a88;
      auVar1 = vpand_avx(auVar1,local_1c8);
      local_318 = local_a88;
      lStack_310 = lStack_a80;
      local_31c = 1;
      auVar2._8_8_ = lStack_a80;
      auVar2._0_8_ = local_a88;
      local_738 = vpsrld_avx(auVar2,ZEXT416(1));
      local_5fa = 0x55;
      local_189 = 0x55;
      local_18a = 0x55;
      local_18b = 0x55;
      local_18c = 0x55;
      local_18d = 0x55;
      local_18e = 0x55;
      local_18f = 0x55;
      local_190 = 0x55;
      local_191 = 0x55;
      local_192 = 0x55;
      local_193 = 0x55;
      local_194 = 0x55;
      local_195 = 0x55;
      local_196 = 0x55;
      local_197 = 0x55;
      local_198 = 0x55;
      auVar2 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
      auVar2 = vpinsrb_avx(auVar2,0x55,2);
      auVar2 = vpinsrb_avx(auVar2,0x55,3);
      auVar2 = vpinsrb_avx(auVar2,0x55,4);
      auVar2 = vpinsrb_avx(auVar2,0x55,5);
      auVar2 = vpinsrb_avx(auVar2,0x55,6);
      auVar2 = vpinsrb_avx(auVar2,0x55,7);
      auVar2 = vpinsrb_avx(auVar2,0x55,8);
      auVar2 = vpinsrb_avx(auVar2,0x55,9);
      auVar2 = vpinsrb_avx(auVar2,0x55,10);
      auVar2 = vpinsrb_avx(auVar2,0x55,0xb);
      auVar2 = vpinsrb_avx(auVar2,0x55,0xc);
      auVar2 = vpinsrb_avx(auVar2,0x55,0xd);
      auVar2 = vpinsrb_avx(auVar2,0x55,0xe);
      local_1a8 = vpinsrb_avx(auVar2,0x55,0xf);
      local_748 = local_1a8._0_8_;
      uStack_740 = local_1a8._8_8_;
      auVar2 = vpand_avx(local_738,local_1a8);
      local_b78 = auVar1._0_8_;
      uStack_b70 = auVar1._8_8_;
      local_b88 = auVar2._0_8_;
      uStack_b80 = auVar2._8_8_;
      local_258 = local_b78;
      uStack_250 = uStack_b70;
      local_268 = local_b88;
      uStack_260 = uStack_b80;
      auVar2 = vphaddw_avx(auVar1,auVar2);
      local_b68 = auVar2._0_8_;
      uStack_b60 = auVar2._8_8_;
      local_5fb = 0x33;
      local_169 = 0x33;
      local_16a = 0x33;
      local_16b = 0x33;
      local_16c = 0x33;
      local_16d = 0x33;
      local_16e = 0x33;
      local_16f = 0x33;
      local_170 = 0x33;
      local_171 = 0x33;
      local_172 = 0x33;
      local_173 = 0x33;
      local_174 = 0x33;
      local_175 = 0x33;
      local_176 = 0x33;
      local_177 = 0x33;
      local_178 = 0x33;
      auVar1 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
      auVar1 = vpinsrb_avx(auVar1,0x33,2);
      auVar1 = vpinsrb_avx(auVar1,0x33,3);
      auVar1 = vpinsrb_avx(auVar1,0x33,4);
      auVar1 = vpinsrb_avx(auVar1,0x33,5);
      auVar1 = vpinsrb_avx(auVar1,0x33,6);
      auVar1 = vpinsrb_avx(auVar1,0x33,7);
      auVar1 = vpinsrb_avx(auVar1,0x33,8);
      auVar1 = vpinsrb_avx(auVar1,0x33,9);
      auVar1 = vpinsrb_avx(auVar1,0x33,10);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xb);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xc);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xd);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xe);
      local_188 = vpinsrb_avx(auVar1,0x33,0xf);
      local_758 = local_b68;
      uStack_750 = uStack_b60;
      local_768 = local_188._0_8_;
      uStack_760 = local_188._8_8_;
      auVar1 = vpand_avx(auVar2,local_188);
      local_338 = local_b68;
      uStack_330 = uStack_b60;
      local_33c = 2;
      local_778 = vpsrld_avx(auVar2,ZEXT416(2));
      local_5fc = 0x33;
      local_149 = 0x33;
      local_14a = 0x33;
      local_14b = 0x33;
      local_14c = 0x33;
      local_14d = 0x33;
      local_14e = 0x33;
      local_14f = 0x33;
      local_150 = 0x33;
      local_151 = 0x33;
      local_152 = 0x33;
      local_153 = 0x33;
      local_154 = 0x33;
      local_155 = 0x33;
      local_156 = 0x33;
      local_157 = 0x33;
      local_158 = 0x33;
      auVar2 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
      auVar2 = vpinsrb_avx(auVar2,0x33,2);
      auVar2 = vpinsrb_avx(auVar2,0x33,3);
      auVar2 = vpinsrb_avx(auVar2,0x33,4);
      auVar2 = vpinsrb_avx(auVar2,0x33,5);
      auVar2 = vpinsrb_avx(auVar2,0x33,6);
      auVar2 = vpinsrb_avx(auVar2,0x33,7);
      auVar2 = vpinsrb_avx(auVar2,0x33,8);
      auVar2 = vpinsrb_avx(auVar2,0x33,9);
      auVar2 = vpinsrb_avx(auVar2,0x33,10);
      auVar2 = vpinsrb_avx(auVar2,0x33,0xb);
      auVar2 = vpinsrb_avx(auVar2,0x33,0xc);
      auVar2 = vpinsrb_avx(auVar2,0x33,0xd);
      auVar2 = vpinsrb_avx(auVar2,0x33,0xe);
      local_168 = vpinsrb_avx(auVar2,0x33,0xf);
      local_788 = local_168._0_8_;
      uStack_780 = local_168._8_8_;
      auVar2 = vpand_avx(local_778,local_168);
      local_ba8 = auVar1._0_8_;
      uStack_ba0 = auVar1._8_8_;
      local_bb8 = auVar2._0_8_;
      uStack_bb0 = auVar2._8_8_;
      local_278 = local_ba8;
      uStack_270 = uStack_ba0;
      local_288 = local_bb8;
      uStack_280 = uStack_bb0;
      auVar2 = vphaddw_avx(auVar1,auVar2);
      local_b98 = auVar2._0_8_;
      uStack_b90 = auVar2._8_8_;
      local_5fd = 0xf;
      local_129 = 0xf;
      local_12a = 0xf;
      local_12b = 0xf;
      local_12c = 0xf;
      local_12d = 0xf;
      local_12e = 0xf;
      local_12f = 0xf;
      local_130 = 0xf;
      local_131 = 0xf;
      local_132 = 0xf;
      local_133 = 0xf;
      local_134 = 0xf;
      local_135 = 0xf;
      local_136 = 0xf;
      local_137 = 0xf;
      local_138 = 0xf;
      auVar1 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
      auVar1 = vpinsrb_avx(auVar1,0xf,2);
      auVar1 = vpinsrb_avx(auVar1,0xf,3);
      auVar1 = vpinsrb_avx(auVar1,0xf,4);
      auVar1 = vpinsrb_avx(auVar1,0xf,5);
      auVar1 = vpinsrb_avx(auVar1,0xf,6);
      auVar1 = vpinsrb_avx(auVar1,0xf,7);
      auVar1 = vpinsrb_avx(auVar1,0xf,8);
      auVar1 = vpinsrb_avx(auVar1,0xf,9);
      auVar1 = vpinsrb_avx(auVar1,0xf,10);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xb);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xc);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xd);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xe);
      local_148 = vpinsrb_avx(auVar1,0xf,0xf);
      local_798 = local_b98;
      uStack_790 = uStack_b90;
      local_7a8 = local_148._0_8_;
      uStack_7a0 = local_148._8_8_;
      auVar1 = vpand_avx(auVar2,local_148);
      local_358 = local_b98;
      uStack_350 = uStack_b90;
      local_35c = 4;
      local_7b8 = vpsrld_avx(auVar2,ZEXT416(4));
      local_5fe = 0xf;
      local_109 = 0xf;
      local_10a = 0xf;
      local_10b = 0xf;
      local_10c = 0xf;
      local_10d = 0xf;
      local_10e = 0xf;
      local_10f = 0xf;
      local_110 = 0xf;
      local_111 = 0xf;
      local_112 = 0xf;
      local_113 = 0xf;
      local_114 = 0xf;
      local_115 = 0xf;
      local_116 = 0xf;
      local_117 = 0xf;
      local_118 = 0xf;
      auVar2 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
      auVar2 = vpinsrb_avx(auVar2,0xf,2);
      auVar2 = vpinsrb_avx(auVar2,0xf,3);
      auVar2 = vpinsrb_avx(auVar2,0xf,4);
      auVar2 = vpinsrb_avx(auVar2,0xf,5);
      auVar2 = vpinsrb_avx(auVar2,0xf,6);
      auVar2 = vpinsrb_avx(auVar2,0xf,7);
      auVar2 = vpinsrb_avx(auVar2,0xf,8);
      auVar2 = vpinsrb_avx(auVar2,0xf,9);
      auVar2 = vpinsrb_avx(auVar2,0xf,10);
      auVar2 = vpinsrb_avx(auVar2,0xf,0xb);
      auVar2 = vpinsrb_avx(auVar2,0xf,0xc);
      auVar2 = vpinsrb_avx(auVar2,0xf,0xd);
      auVar2 = vpinsrb_avx(auVar2,0xf,0xe);
      local_128 = vpinsrb_avx(auVar2,0xf,0xf);
      local_7c8 = local_128._0_8_;
      uStack_7c0 = local_128._8_8_;
      auVar2 = vpand_avx(local_7b8,local_128);
      local_bd8 = auVar1._0_8_;
      uStack_bd0 = auVar1._8_8_;
      local_be8 = auVar2._0_8_;
      uStack_be0 = auVar2._8_8_;
      local_298 = local_bd8;
      uStack_290 = uStack_bd0;
      local_2a8 = local_be8;
      uStack_2a0 = uStack_be0;
      auVar1 = vphaddw_avx(auVar1,auVar2);
      local_240 = 0xff;
      local_2c = 0xff;
      local_30 = 0xff;
      local_34 = 0xff;
      local_38 = 0xff;
      auVar2 = vpinsrd_avx(ZEXT416(0xff),0xff,1);
      auVar2 = vpinsrd_avx(auVar2,0xff,2);
      local_48 = vpinsrd_avx(auVar2,0xff,3);
      local_8a8 = vpand_avx(auVar1,local_48);
      local_898 = local_b48._0_8_;
      uStack_890 = local_b48._8_8_;
      local_b48 = vpaddd_avx(local_b48,local_8a8);
      local_bc8 = auVar1._0_8_;
      uStack_bc0 = auVar1._8_8_;
      local_378 = local_bc8;
      uStack_370 = uStack_bc0;
      local_37c = 8;
      auVar2 = vpsrld_avx(auVar1,ZEXT416(8));
      local_8c8 = vpand_avx(auVar2,local_48);
      local_8b8 = local_b38._0_8_;
      uStack_8b0 = local_b38._8_8_;
      local_b38 = vpaddd_avx(local_b38,local_8c8);
      local_398 = local_bc8;
      uStack_390 = uStack_bc0;
      local_39c = 0x10;
      auVar2 = vpsrld_avx(auVar1,ZEXT416(0x10));
      local_8e8 = vpand_avx(auVar2,local_48);
      local_8d8 = local_b28._0_8_;
      uStack_8d0 = local_b28._8_8_;
      local_b28 = vpaddd_avx(local_b28,local_8e8);
      local_3b8 = local_bc8;
      uStack_3b0 = uStack_bc0;
      local_3bc = 0x18;
      auVar1 = vpsrld_avx(auVar1,ZEXT416(0x18));
      local_908 = vpand_avx(auVar1,local_48);
      local_8f8 = local_b18._0_8_;
      uStack_8f0 = local_b18._8_8_;
      local_b18 = vpaddd_avx(local_b18,local_908);
      b_13[1]._0_4_ = 0xff;
      b_13[0] = 0xff;
      b_13[1]._4_4_ = 0;
      c_13[1] = in_R9;
      c_13[0] = in_R8;
      pospopcnt_csa_sse((__m128i *)&local_a88,(__m128i *)&local_a78,b_13,c_13);
      pauVar7 = extraout_RDX_12;
    }
    local_7d8 = local_a88;
    lStack_7d0 = lStack_a80;
    local_5ff = 0x55;
    local_f8 = 0x55;
    auVar1 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
    auVar1 = vpinsrb_avx(auVar1,0x55,2);
    auVar1 = vpinsrb_avx(auVar1,0x55,3);
    auVar1 = vpinsrb_avx(auVar1,0x55,4);
    auVar1 = vpinsrb_avx(auVar1,0x55,5);
    auVar1 = vpinsrb_avx(auVar1,0x55,6);
    auVar1 = vpinsrb_avx(auVar1,0x55,7);
    auVar1 = vpinsrb_avx(auVar1,0x55,8);
    auVar1 = vpinsrb_avx(auVar1,0x55,9);
    auVar1 = vpinsrb_avx(auVar1,0x55,10);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xe);
    local_108 = vpinsrb_avx(auVar1,0x55,0xf);
    local_7e8 = local_108._0_8_;
    uStack_7e0 = local_108._8_8_;
    auVar3._8_8_ = lStack_a80;
    auVar3._0_8_ = local_a88;
    auVar1 = vpand_avx(auVar3,local_108);
    local_3d8 = local_a88;
    lStack_3d0 = lStack_a80;
    local_3dc = 1;
    auVar4._8_8_ = lStack_a80;
    auVar4._0_8_ = local_a88;
    local_7f8 = vpsrld_avx(auVar4,ZEXT416(1));
    local_600 = 0x55;
    local_d8 = 0x55;
    auVar2 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
    auVar2 = vpinsrb_avx(auVar2,0x55,2);
    auVar2 = vpinsrb_avx(auVar2,0x55,3);
    auVar2 = vpinsrb_avx(auVar2,0x55,4);
    auVar2 = vpinsrb_avx(auVar2,0x55,5);
    auVar2 = vpinsrb_avx(auVar2,0x55,6);
    auVar2 = vpinsrb_avx(auVar2,0x55,7);
    auVar2 = vpinsrb_avx(auVar2,0x55,8);
    auVar2 = vpinsrb_avx(auVar2,0x55,9);
    auVar2 = vpinsrb_avx(auVar2,0x55,10);
    auVar2 = vpinsrb_avx(auVar2,0x55,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x55,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x55,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x55,0xe);
    local_e8 = vpinsrb_avx(auVar2,0x55,0xf);
    local_808 = local_e8._0_8_;
    uStack_800 = local_e8._8_8_;
    auVar2 = vpand_avx(local_7f8,local_e8);
    local_c18 = auVar1._0_8_;
    local_2b8 = local_c18;
    uStack_c10 = auVar1._8_8_;
    uStack_2b0 = uStack_c10;
    local_c28 = auVar2._0_8_;
    local_2c8 = local_c28;
    uStack_c20 = auVar2._8_8_;
    uStack_2c0 = uStack_c20;
    auVar2 = vphaddw_avx(auVar1,auVar2);
    local_c08 = auVar2._0_8_;
    local_818 = local_c08;
    uStack_c00 = auVar2._8_8_;
    uStack_810 = uStack_c00;
    local_601 = 0x33;
    local_b8 = 0x33;
    auVar1 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
    auVar1 = vpinsrb_avx(auVar1,0x33,2);
    auVar1 = vpinsrb_avx(auVar1,0x33,3);
    auVar1 = vpinsrb_avx(auVar1,0x33,4);
    auVar1 = vpinsrb_avx(auVar1,0x33,5);
    auVar1 = vpinsrb_avx(auVar1,0x33,6);
    auVar1 = vpinsrb_avx(auVar1,0x33,7);
    auVar1 = vpinsrb_avx(auVar1,0x33,8);
    auVar1 = vpinsrb_avx(auVar1,0x33,9);
    auVar1 = vpinsrb_avx(auVar1,0x33,10);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xe);
    local_c8 = vpinsrb_avx(auVar1,0x33,0xf);
    local_828 = local_c8._0_8_;
    uStack_820 = local_c8._8_8_;
    auVar1 = vpand_avx(auVar2,local_c8);
    local_3f8 = local_c08;
    uStack_3f0 = uStack_c00;
    local_3fc = 2;
    local_838 = vpsrld_avx(auVar2,ZEXT416(2));
    local_602 = 0x33;
    local_98 = 0x33;
    auVar2 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
    auVar2 = vpinsrb_avx(auVar2,0x33,2);
    auVar2 = vpinsrb_avx(auVar2,0x33,3);
    auVar2 = vpinsrb_avx(auVar2,0x33,4);
    auVar2 = vpinsrb_avx(auVar2,0x33,5);
    auVar2 = vpinsrb_avx(auVar2,0x33,6);
    auVar2 = vpinsrb_avx(auVar2,0x33,7);
    auVar2 = vpinsrb_avx(auVar2,0x33,8);
    auVar2 = vpinsrb_avx(auVar2,0x33,9);
    auVar2 = vpinsrb_avx(auVar2,0x33,10);
    auVar2 = vpinsrb_avx(auVar2,0x33,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x33,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x33,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x33,0xe);
    local_a8 = vpinsrb_avx(auVar2,0x33,0xf);
    local_848 = local_a8._0_8_;
    uStack_840 = local_a8._8_8_;
    auVar2 = vpand_avx(local_838,local_a8);
    local_c48 = auVar1._0_8_;
    local_2d8 = local_c48;
    uStack_c40 = auVar1._8_8_;
    uStack_2d0 = uStack_c40;
    local_c58 = auVar2._0_8_;
    local_2e8 = local_c58;
    uStack_c50 = auVar2._8_8_;
    uStack_2e0 = uStack_c50;
    auVar2 = vphaddw_avx(auVar1,auVar2);
    local_c38 = auVar2._0_8_;
    local_858 = local_c38;
    uStack_c30 = auVar2._8_8_;
    uStack_850 = uStack_c30;
    local_603 = 0xf;
    local_78 = 0xf;
    auVar1 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
    auVar1 = vpinsrb_avx(auVar1,0xf,2);
    auVar1 = vpinsrb_avx(auVar1,0xf,3);
    auVar1 = vpinsrb_avx(auVar1,0xf,4);
    auVar1 = vpinsrb_avx(auVar1,0xf,5);
    auVar1 = vpinsrb_avx(auVar1,0xf,6);
    auVar1 = vpinsrb_avx(auVar1,0xf,7);
    auVar1 = vpinsrb_avx(auVar1,0xf,8);
    auVar1 = vpinsrb_avx(auVar1,0xf,9);
    auVar1 = vpinsrb_avx(auVar1,0xf,10);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xb);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xc);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xd);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xe);
    local_88 = vpinsrb_avx(auVar1,0xf,0xf);
    local_868 = local_88._0_8_;
    uStack_860 = local_88._8_8_;
    auVar1 = vpand_avx(auVar2,local_88);
    local_418 = local_c38;
    uStack_410 = uStack_c30;
    local_41c = 4;
    local_878 = vpsrld_avx(auVar2,ZEXT416(4));
    local_604 = 0xf;
    local_58 = 0xf;
    auVar2 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
    auVar2 = vpinsrb_avx(auVar2,0xf,2);
    auVar2 = vpinsrb_avx(auVar2,0xf,3);
    auVar2 = vpinsrb_avx(auVar2,0xf,4);
    auVar2 = vpinsrb_avx(auVar2,0xf,5);
    auVar2 = vpinsrb_avx(auVar2,0xf,6);
    auVar2 = vpinsrb_avx(auVar2,0xf,7);
    auVar2 = vpinsrb_avx(auVar2,0xf,8);
    auVar2 = vpinsrb_avx(auVar2,0xf,9);
    auVar2 = vpinsrb_avx(auVar2,0xf,10);
    auVar2 = vpinsrb_avx(auVar2,0xf,0xb);
    auVar2 = vpinsrb_avx(auVar2,0xf,0xc);
    auVar2 = vpinsrb_avx(auVar2,0xf,0xd);
    auVar2 = vpinsrb_avx(auVar2,0xf,0xe);
    local_68 = vpinsrb_avx(auVar2,0xf,0xf);
    local_888 = local_68._0_8_;
    uStack_880 = local_68._8_8_;
    auVar2 = vpand_avx(local_878,local_68);
    local_c78 = auVar1._0_8_;
    local_2f8 = local_c78;
    uStack_c70 = auVar1._8_8_;
    uStack_2f0 = uStack_c70;
    local_c88 = auVar2._0_8_;
    local_308 = local_c88;
    uStack_c80 = auVar2._8_8_;
    uStack_300 = uStack_c80;
    auVar1 = vphaddw_avx(auVar1,auVar2);
    local_244 = 0xff;
    local_10 = 0xff;
    pauVar7 = (undefined1 (*) [16])0xff;
    auVar2 = vpinsrd_avx(ZEXT416(0xff),0xff,1);
    auVar2 = vpinsrd_avx(auVar2,0xff,2);
    local_28 = vpinsrd_avx(auVar2,0xff,3);
    local_918 = local_b48._0_8_;
    uStack_910 = local_b48._8_8_;
    local_928 = vpand_avx(auVar1,local_28);
    local_b48 = vpaddd_avx(local_b48,local_928);
    local_938 = local_b38._0_8_;
    uStack_930 = local_b38._8_8_;
    local_c68 = auVar1._0_8_;
    local_438 = local_c68;
    uStack_c60 = auVar1._8_8_;
    uStack_430 = uStack_c60;
    local_43c = 8;
    auVar2 = vpsrld_avx(auVar1,ZEXT416(8));
    local_948 = vpand_avx(auVar2,local_28);
    local_b38 = vpaddd_avx(local_b38,local_948);
    local_958 = local_b28._0_8_;
    uStack_950 = local_b28._8_8_;
    local_458 = local_c68;
    uStack_450 = uStack_c60;
    local_45c = 0x10;
    auVar2 = vpsrld_avx(auVar1,ZEXT416(0x10));
    local_968 = vpand_avx(auVar2,local_28);
    local_b28 = vpaddd_avx(local_b28,local_968);
    local_978 = local_b18._0_8_;
    uStack_970 = local_b18._8_8_;
    local_478 = local_c68;
    uStack_470 = uStack_c60;
    local_47c = 0x18;
    auVar1 = vpsrld_avx(auVar1,ZEXT416(0x18));
    local_988 = vpand_avx(auVar1,local_28);
    local_b18 = vpaddd_avx(local_b18,local_988);
    local_f7 = local_f8;
    local_f6 = local_f8;
    local_f5 = local_f8;
    local_f4 = local_f8;
    local_f3 = local_f8;
    local_f2 = local_f8;
    local_f1 = local_f8;
    local_f0 = local_f8;
    local_ef = local_f8;
    local_ee = local_f8;
    local_ed = local_f8;
    local_ec = local_f8;
    local_eb = local_f8;
    local_ea = local_f8;
    local_e9 = local_f8;
    local_d7 = local_d8;
    local_d6 = local_d8;
    local_d5 = local_d8;
    local_d4 = local_d8;
    local_d3 = local_d8;
    local_d2 = local_d8;
    local_d1 = local_d8;
    local_d0 = local_d8;
    local_cf = local_d8;
    local_ce = local_d8;
    local_cd = local_d8;
    local_cc = local_d8;
    local_cb = local_d8;
    local_ca = local_d8;
    local_c9 = local_d8;
    local_b7 = local_b8;
    local_b6 = local_b8;
    local_b5 = local_b8;
    local_b4 = local_b8;
    local_b3 = local_b8;
    local_b2 = local_b8;
    local_b1 = local_b8;
    local_b0 = local_b8;
    local_af = local_b8;
    local_ae = local_b8;
    local_ad = local_b8;
    local_ac = local_b8;
    local_ab = local_b8;
    local_aa = local_b8;
    local_a9 = local_b8;
    local_97 = local_98;
    local_96 = local_98;
    local_95 = local_98;
    local_94 = local_98;
    local_93 = local_98;
    local_92 = local_98;
    local_91 = local_98;
    local_90 = local_98;
    local_8f = local_98;
    local_8e = local_98;
    local_8d = local_98;
    local_8c = local_98;
    local_8b = local_98;
    local_8a = local_98;
    local_89 = local_98;
    local_77 = local_78;
    local_76 = local_78;
    local_75 = local_78;
    local_74 = local_78;
    local_73 = local_78;
    local_72 = local_78;
    local_71 = local_78;
    local_70 = local_78;
    local_6f = local_78;
    local_6e = local_78;
    local_6d = local_78;
    local_6c = local_78;
    local_6b = local_78;
    local_6a = local_78;
    local_69 = local_78;
    local_57 = local_58;
    local_56 = local_58;
    local_55 = local_58;
    local_54 = local_58;
    local_53 = local_58;
    local_52 = local_58;
    local_51 = local_58;
    local_50 = local_58;
    local_4f = local_58;
    local_4e = local_58;
    local_4d = local_58;
    local_4c = local_58;
    local_4b = local_58;
    local_4a = local_58;
    local_49 = local_58;
    local_c = local_10;
    local_8 = local_10;
    local_4 = local_10;
  }
  auVar2 = vpslld_avx(local_b48,ZEXT416(4));
  auVar3 = vpslld_avx(local_b38,ZEXT416(4));
  auVar4 = vpslld_avx(local_b28,ZEXT416(4));
  auVar5 = vpslld_avx(local_b18,ZEXT416(4));
  auVar1 = vpunpckldq_avx(auVar2,auVar4);
  auVar1 = vpaddd_avx(*local_a20,auVar1);
  local_cc8 = auVar1._0_8_;
  uStack_cc0 = auVar1._8_8_;
  *(undefined8 *)*local_a20 = local_cc8;
  *(undefined8 *)(*local_a20 + 8) = uStack_cc0;
  auVar1 = vpunpckhdq_avx(auVar2,auVar4);
  auVar1 = vpaddd_avx(local_a20[1],auVar1);
  local_cf8 = auVar1._0_8_;
  uStack_cf0 = auVar1._8_8_;
  *(undefined8 *)local_a20[1] = local_cf8;
  *(undefined8 *)(local_a20[1] + 8) = uStack_cf0;
  auVar1 = vpunpckldq_avx(auVar3,auVar5);
  auVar1 = vpaddd_avx(local_a20[2],auVar1);
  local_d28 = auVar1._0_8_;
  uStack_d20 = auVar1._8_8_;
  *(undefined8 *)local_a20[2] = local_d28;
  *(undefined8 *)(local_a20[2] + 8) = uStack_d20;
  auVar1 = vpunpckhdq_avx(auVar3,auVar5);
  auVar1 = vpaddd_avx(local_a20[3],auVar1);
  local_d58 = auVar1._0_8_;
  uStack_d50 = auVar1._8_8_;
  *(undefined8 *)local_a20[3] = local_d58;
  *(undefined8 *)(local_a20[3] + 8) = uStack_d50;
  local_b08 = local_a48;
  lStack_b00 = lStack_a40;
  for (local_d60 = 0; local_d60 < 8; local_d60 = local_d60 + 1) {
    for (local_d64 = 0; local_d64 < 0x10; local_d64 = local_d64 + 1) {
      *(int *)(*local_a20 + (long)local_d64 * 4) =
           ((int)((uint)*(ushort *)((long)&local_b08 + local_d60 * 2) &
                 1 << ((byte)local_d64 & 0x1f)) >> ((byte)local_d64 & 0x1f)) +
           *(int *)(*local_a20 + (long)local_d64 * 4);
    }
  }
  local_b08 = local_a58;
  lStack_b00 = lStack_a50;
  for (local_d70 = 0; local_d70 < 8; local_d70 = local_d70 + 1) {
    for (local_d74 = 0; local_d74 < 0x10; local_d74 = local_d74 + 1) {
      *(int *)(*local_a20 + (long)local_d74 * 4) =
           ((int)((uint)*(ushort *)((long)&local_b08 + local_d70 * 2) &
                 1 << ((byte)local_d74 & 0x1f)) >> ((byte)local_d74 & 0x1f)) * 2 +
           *(int *)(*local_a20 + (long)local_d74 * 4);
    }
  }
  local_b08 = local_a68;
  lStack_b00 = lStack_a60;
  for (local_d80 = 0; local_d80 < 8; local_d80 = local_d80 + 1) {
    for (local_d84 = 0; local_d84 < 0x10; local_d84 = local_d84 + 1) {
      *(int *)(*local_a20 + (long)local_d84 * 4) =
           ((int)((uint)*(ushort *)((long)&local_b08 + local_d80 * 2) &
                 1 << ((byte)local_d84 & 0x1f)) >> ((byte)local_d84 & 0x1f)) * 4 +
           *(int *)(*local_a20 + (long)local_d84 * 4);
    }
  }
  local_b08 = local_a78;
  lStack_b00 = lStack_a70;
  for (local_d90 = 0; local_d90 < 8; local_d90 = local_d90 + 1) {
    for (local_d94 = 0; local_d94 < 0x10; local_d94 = local_d94 + 1) {
      *(int *)(*local_a20 + (long)local_d94 * 4) =
           ((int)((uint)*(ushort *)((long)&local_b08 + local_d90 * 2) &
                 1 << ((byte)local_d94 & 0x1f)) >> ((byte)local_d94 & 0x1f)) * 8 +
           *(int *)(*local_a20 + (long)local_d94 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_harley_seal_improved(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (16 * 8)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m128i* data = (const __m128i*)array;
    size_t size = len / 8;
    __m128i v1  = _mm_setzero_si128();
    __m128i v2  = _mm_setzero_si128();
    __m128i v4  = _mm_setzero_si128();
    __m128i v8  = _mm_setzero_si128();
    __m128i v16 = _mm_setzero_si128();
    __m128i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint16_t buffer[8];
    __m128i counter[4];
    for (size_t i = 0; i < 4; ++i) {
        counter[i] = _mm_setzero_si128();
    }

    while (i < limit) {

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define horizreduce(input, mask, shift, output) \
        __m128i output; \
        { \
            const __m128i tmp0 = _mm_and_si128(input, mask); \
            const __m128i tmp1 = _mm_and_si128(_mm_srli_epi32(input, shift), mask); \
            output = _mm_hadd_epi16(tmp0, tmp1); \
        }

            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  0), _mm_loadu_si128(data + i +  1));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  2), _mm_loadu_si128(data + i +  3));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  4), _mm_loadu_si128(data + i +  5));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  6), _mm_loadu_si128(data + i +  7));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  8),  _mm_loadu_si128(data + i +  9));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 10),  _mm_loadu_si128(data + i + 11));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i + 12),  _mm_loadu_si128(data + i + 13));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 14),  _mm_loadu_si128(data + i + 15));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsB,&v4, foursA, foursB);
            {
                horizreduce(v16, _mm_set1_epi8(0x55), 1, t0); // t0 = 2-bit counters
                horizreduce(t0,  _mm_set1_epi8(0x33), 2, t1); // t1 = 4-bit counters
                horizreduce(t1,  _mm_set1_epi8(0x0f), 4, t2); // t2 = 8-bit counters

                const __m128i mask_byte0 = _mm_set1_epi32(0x000000ff);
                counter[0] = _mm_add_epi32(counter[0], t2 & mask_byte0);
                counter[1] = _mm_add_epi32(counter[1], _mm_srli_epi32(t2, 1*8) & mask_byte0);
                counter[2] = _mm_add_epi32(counter[2], _mm_srli_epi32(t2, 2*8) & mask_byte0);
                counter[3] = _mm_add_epi32(counter[3], _mm_srli_epi32(t2, 3*8) & mask_byte0);
            }
            pospopcnt_csa_sse(&v16, &v8, eightsA, eightsB);
        } // for

        // update the counters after the last iteration
        {
            horizreduce(v16, _mm_set1_epi8(0x55), 1, t0);
            horizreduce(t0,  _mm_set1_epi8(0x33), 2, t1);
            horizreduce(t1,  _mm_set1_epi8(0x0f), 4, t2);

            const __m128i mask_byte0 = _mm_set1_epi32(0x000000ff);
            counter[0] = _mm_add_epi32(counter[0], t2 & mask_byte0);
            counter[1] = _mm_add_epi32(counter[1], _mm_srli_epi32(t2, 1*8) & mask_byte0);
            counter[2] = _mm_add_epi32(counter[2], _mm_srli_epi32(t2, 2*8) & mask_byte0);
            counter[3] = _mm_add_epi32(counter[3], _mm_srli_epi32(t2, 3*8) & mask_byte0);
        }
#undef horizreduce
    }

    counter[0] = _mm_slli_epi32(counter[0], 4); // * 16
    counter[1] = _mm_slli_epi32(counter[1], 4); // * 16
    counter[2] = _mm_slli_epi32(counter[2], 4); // * 16
    counter[3] = _mm_slli_epi32(counter[3], 4); // * 16

#if 0 // Left to illustrate the mapping between auxiliary counters and flags.
    flags[0] += _mm_extract_epi32(counter[0], 0);
    flags[1] += _mm_extract_epi32(counter[2], 0);
    flags[2] += _mm_extract_epi32(counter[0], 1);
    flags[3] += _mm_extract_epi32(counter[2], 1);
    flags[4] += _mm_extract_epi32(counter[0], 2);
    flags[5] += _mm_extract_epi32(counter[2], 2);
    flags[6] += _mm_extract_epi32(counter[0], 3);
    flags[7] += _mm_extract_epi32(counter[2], 3);

    flags[8]  += _mm_extract_epi32(counter[1], 0);
    flags[9]  += _mm_extract_epi32(counter[3], 0);
    flags[10] += _mm_extract_epi32(counter[1], 1);
    flags[11] += _mm_extract_epi32(counter[3], 1);
    flags[12] += _mm_extract_epi32(counter[1], 2);
    flags[13] += _mm_extract_epi32(counter[3], 2);
    flags[14] += _mm_extract_epi32(counter[1], 3);
    flags[15] += _mm_extract_epi32(counter[3], 3);
#else
#define update_flags(offset, counters)                  \
    {                                                   \
        __m128i* ptr = (__m128i*)(flags + offset);      \
        const __m128i f = _mm_loadu_si128(ptr);         \
        const __m128i s = _mm_add_epi32(f, counters);   \
        _mm_storeu_si128(ptr, s);                       \
    }
    update_flags(0  /*  0 ..  3 */, _mm_unpacklo_epi32(counter[0], counter[2]));
    update_flags(4  /*  4 ..  7 */, _mm_unpackhi_epi32(counter[0], counter[2]));
    update_flags(8  /*  8 .. 11 */, _mm_unpacklo_epi32(counter[1], counter[3]));
    update_flags(12 /* 12 .. 15 */, _mm_unpackhi_epi32(counter[1], counter[3]));
#undef update_flags
#endif

    _mm_storeu_si128((__m128i*)buffer, v1);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v2);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v4);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v8);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}